

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

HivePartitioningIndex *
duckdb::HivePartitioningIndex::Deserialize
          (HivePartitioningIndex *__return_storage_ptr__,Deserializer *deserializer)

{
  int iVar1;
  idx_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  undefined1 local_30;
  undefined8 local_2f;
  undefined4 local_27;
  undefined2 local_23;
  char local_21;
  undefined4 extraout_var;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"value");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_30 = 0;
    local_80 = &local_70;
    local_70._M_local_buf[0] = '\0';
    local_70._M_allocated_capacity._1_7_ = (undefined7)local_2f;
    local_70._M_local_buf[8] = (char)((ulong)local_2f >> 0x38);
    local_70._9_4_ = local_27;
    local_70._13_2_ = local_23;
    local_70._M_local_buf[0xf] = local_21;
    local_78 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_80,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"index");
  if ((char)iVar1 == '\0') {
    index = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    index = CONCAT44(extraout_var,iVar1);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  if (local_80 == &local_70) {
    local_60.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT25(local_70._13_2_,CONCAT41(local_70._9_4_,local_70._M_local_buf[8])));
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
  local_60.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  HivePartitioningIndex(__return_storage_ptr__,&local_60,index);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

HivePartitioningIndex HivePartitioningIndex::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadPropertyWithDefault<string>(100, "value");
	auto index = deserializer.ReadPropertyWithDefault<idx_t>(101, "index");
	HivePartitioningIndex result(std::move(value), index);
	return result;
}